

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QGraphicsItem *item)

{
  QGraphicsItem *this;
  long lVar1;
  _func_int **pp_Var2;
  int iVar3;
  QDebug *pQVar4;
  QWidget *t;
  QGraphicsItem *in_RDX;
  char *pcVar5;
  long in_FS_OFFSET;
  QDebug local_60;
  QArrayDataPointer<char16_t> local_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)item);
  *(undefined1 *)(item->_vptr_QGraphicsItem + 6) = 0;
  if (in_RDX == (QGraphicsItem *)0x0) {
    QDebug::operator<<((QDebug *)item,"QGraphicsItem(0)");
  }
  else {
    this = in_RDX + -1;
    if ((((in_RDX->d_ptr).d)->field_0x167 & 1) == 0) {
      pcVar5 = "QGraphicsItem";
    }
    else {
      (**this->_vptr_QGraphicsItem)(this);
      pcVar5 = (char *)QMetaObject::className();
    }
    QDebug::operator<<((QDebug *)item,pcVar5);
    pQVar4 = QDebug::operator<<((QDebug *)item,'(');
    QDebug::operator<<(pQVar4,in_RDX);
    iVar3 = (*in_RDX->_vptr_QGraphicsItem[0xb])();
    if (iVar3 == 0xc) {
      QDebug::operator<<((QDebug *)item,", widget=");
      t = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)this);
      if (t == (QWidget *)0x0) {
        QDebug::operator<<((QDebug *)item,"QWidget(0)");
      }
      else {
        (*(code *)**(undefined8 **)t)(t);
        pcVar5 = (char *)QMetaObject::className();
        pQVar4 = QDebug::operator<<((QDebug *)item,pcVar5);
        pQVar4 = QDebug::operator<<(pQVar4,'(');
        QDebug::operator<<(pQVar4,t);
        QObject::objectName();
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (local_58.size != 0) {
          pQVar4 = QDebug::operator<<((QDebug *)item,", name=");
          QObject::objectName();
          QDebug::operator<<(pQVar4,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        }
        QDebug::operator<<((QDebug *)item,')');
      }
    }
    local_60.stream = (Stream *)item->_vptr_QGraphicsItem;
    *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
    formatGraphicsItemHelper(&local_60,in_RDX);
    QDebug::~QDebug(&local_60);
    QDebug::operator<<((QDebug *)item,')');
  }
  pp_Var2 = item->_vptr_QGraphicsItem;
  item->_vptr_QGraphicsItem = (_func_int **)0x0;
  *(_func_int ***)debug.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsItem *item)
{
    QDebugStateSaver saver(debug);
    debug.nospace();

    if (!item) {
        debug << "QGraphicsItem(0)";
        return debug;
    }

    if (const QGraphicsObject *o = item->toGraphicsObject())
        debug << o->metaObject()->className();
    else
        debug << "QGraphicsItem";
    debug << '(' << static_cast<const void *>(item);
    if (const QGraphicsProxyWidget *pw = qgraphicsitem_cast<const QGraphicsProxyWidget *>(item)) {
        debug << ", widget=";
        if (const QWidget *w = pw->widget()) {
            debug << w->metaObject()->className() << '(' << static_cast<const void *>(w);
            if (!w->objectName().isEmpty())
                debug << ", name=" << w->objectName();
            debug << ')';
        } else {
            debug << "QWidget(0)";
        }
    }
    formatGraphicsItemHelper(debug, item);
    debug << ')';
    return debug;
}